

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::EnumGenerator::EnumGenerator
          (EnumGenerator *this,EnumDescriptor *descriptor)

{
  EnumDescriptor *this_00;
  int iVar1;
  int iVar2;
  undefined1 local_50 [8];
  Alias alias;
  EnumValueDescriptor *canonical_value;
  EnumValueDescriptor *value;
  int local_1c;
  EnumDescriptor *pEStack_18;
  int i;
  EnumDescriptor *descriptor_local;
  EnumGenerator *this_local;
  
  this->descriptor_ = descriptor;
  pEStack_18 = descriptor;
  descriptor_local = (EnumDescriptor *)this;
  std::
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::vector(&this->canonical_values_);
  std::
  vector<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
  ::vector(&this->aliases_);
  local_1c = 0;
  while( true ) {
    iVar2 = local_1c;
    iVar1 = EnumDescriptor::value_count(this->descriptor_);
    if (iVar1 <= iVar2) break;
    canonical_value = EnumDescriptor::value(this->descriptor_,local_1c);
    this_00 = this->descriptor_;
    iVar2 = EnumValueDescriptor::number(canonical_value);
    alias.canonical_value = EnumDescriptor::FindValueByNumber(this_00,iVar2);
    if (canonical_value == alias.canonical_value) {
      std::
      vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ::push_back(&this->canonical_values_,&canonical_value);
    }
    else {
      local_50 = (undefined1  [8])canonical_value;
      alias.value = alias.canonical_value;
      std::
      vector<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
      ::push_back(&this->aliases_,(value_type *)local_50);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

EnumGenerator::EnumGenerator(const EnumDescriptor* descriptor)
  : descriptor_(descriptor) {
  for (int i = 0; i < descriptor_->value_count(); i++) {
    const EnumValueDescriptor* value = descriptor_->value(i);
    const EnumValueDescriptor* canonical_value =
      descriptor_->FindValueByNumber(value->number());

    if (value == canonical_value) {
      canonical_values_.push_back(value);
    } else {
      Alias alias;
      alias.value = value;
      alias.canonical_value = canonical_value;
      aliases_.push_back(alias);
    }
  }
}